

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.h
# Opt level: O3

void __thiscall
cmLinkImplItem::cmLinkImplItem
          (cmLinkImplItem *this,string *n,cmTarget *t,cmListFileBacktrace *bt,bool fromGenex)

{
  pointer pcVar1;
  cmLinkedTree<cmState::SnapshotDataType> *pcVar2;
  
  (this->super_cmLinkItem).super_string._M_dataplus._M_p =
       (pointer)&(this->super_cmLinkItem).super_string.field_2;
  pcVar1 = (n->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>((string *)this,pcVar1,pcVar1 + n->_M_string_length);
  (this->super_cmLinkItem).Target = t;
  std::vector<cmListFileContext,_std::allocator<cmListFileContext>_>::vector
            (&(this->Backtrace).super_vector<cmListFileContext,_std::allocator<cmListFileContext>_>,
             &bt->super_vector<cmListFileContext,_std::allocator<cmListFileContext>_>);
  (this->Backtrace).Snapshot.Position.Position = (bt->Snapshot).Position.Position;
  pcVar2 = (bt->Snapshot).Position.Tree;
  (this->Backtrace).Snapshot.State = (bt->Snapshot).State;
  (this->Backtrace).Snapshot.Position.Tree = pcVar2;
  this->FromGenex = fromGenex;
  return;
}

Assistant:

cmLinkImplItem(std::string const& n,
                 cmTarget const* t,
                 cmListFileBacktrace const& bt,
                 bool fromGenex):
    cmLinkItem(n, t), Backtrace(bt), FromGenex(fromGenex) {}